

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncRgbLedAnalyzerResults.cpp
# Opt level: O0

void __thiscall
AsyncRgbLedAnalyzerResults::GenerateFrameTabularText
          (AsyncRgbLedAnalyzerResults *this,U64 frame_index,DisplayBase display_base)

{
  char local_c8 [8];
  char buf [64];
  char local_7c [8];
  char blueString [8];
  char greenString [8];
  char redString [8];
  int colorNumericBufferLength;
  RGBValue rgb;
  U32 ledIndex;
  Frame local_48 [8];
  Frame frame;
  U64 local_38;
  uint local_30;
  DisplayBase display_base_local;
  U64 frame_index_local;
  AsyncRgbLedAnalyzerResults *this_local;
  
  AnalyzerResults::GetFrame((ulonglong)local_48);
  AnalyzerResults::ClearTabularText();
  register0x00000000 = RGBValue::CreateFromU64(local_38);
  redString[0] = '\b';
  redString[1] = '\0';
  redString[2] = '\0';
  redString[3] = '\0';
  GenerateRGBStrings(this,(RGBValue *)(redString + 4),display_base,8,greenString,blueString,local_7c
                    );
  snprintf(local_c8,0x40,"[%d] %s, %s, %s",(ulong)local_30,greenString,blueString,local_7c);
  AnalyzerResults::AddTabularText
            ((char *)this,local_c8,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
  Frame::~Frame(local_48);
  return;
}

Assistant:

void AsyncRgbLedAnalyzerResults::GenerateFrameTabularText( U64 frame_index, DisplayBase display_base )
{
#ifdef SUPPORTS_PROTOCOL_SEARCH
    Frame frame = GetFrame( frame_index );
    ClearTabularText();

    const U32 ledIndex = frame.mData2;
    const RGBValue rgb = RGBValue::CreateFromU64( frame.mData1 );

    const int colorNumericBufferLength = 8;
    char redString[ colorNumericBufferLength ], greenString[ colorNumericBufferLength ], blueString[ colorNumericBufferLength ];

    GenerateRGBStrings( rgb, display_base, colorNumericBufferLength, redString, greenString, blueString );

    // target content: [13] 0x1A, 0x2B, 0x3C
    char buf[ 64 ];
    ::snprintf( buf, 64, "[%d] %s, %s, %s", ledIndex, redString, greenString, blueString );
    AddTabularText( buf );
#endif
}